

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall
kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper(BufferedOutputStreamWrapper *this)

{
  bool bVar1;
  Runnable local_20;
  BufferedOutputStreamWrapper *local_18;
  
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__BufferedOutputStreamWrapper_004341e0;
  bVar1 = UnwindDetector::isUnwinding(&this->unwindDetector);
  if (bVar1) {
    local_20._vptr_Runnable = (_func_int **)&PTR_run_004344e8;
    local_18 = this;
    UnwindDetector::catchExceptionsAsSecondaryFaults(&this->unwindDetector,&local_20);
  }
  else {
    flush(this);
  }
  Array<unsigned_char>::~Array(&this->ownedBuffer);
  return;
}

Assistant:

BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper() noexcept(false) {
  unwindDetector.catchExceptionsIfUnwinding([&]() {
    flush();
  });
}